

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationDataBuilder::addConditionalCE32
          (CollationDataBuilder *this,UnicodeString *context,uint32_t ce32,UErrorCode *errorCode)

{
  int iVar1;
  void *obj;
  int iVar2;
  
  iVar2 = -1;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (this->conditionalCE32s).count;
    if (iVar1 < 0x80000) {
      obj = UMemory::operator_new((UMemory *)0x58,(size_t)context);
      if (obj == (void *)0x0) {
        obj = (void *)0x0;
      }
      else {
        UnicodeString::UnicodeString((UnicodeString *)((long)obj + 8),context);
        *(uint32_t *)((long)obj + 0x48) = ce32;
        *(undefined8 *)((long)obj + 0x4c) = 0x100000001;
        *(undefined4 *)((long)obj + 0x54) = 0xffffffff;
      }
      if (obj == (void *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVector::addElement(&this->conditionalCE32s,obj,errorCode);
        iVar2 = iVar1;
      }
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addConditionalCE32(const UnicodeString &context, uint32_t ce32,
                                         UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return -1; }
    U_ASSERT(!context.isEmpty());
    int32_t index = conditionalCE32s.size();
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return -1;
    }
    ConditionalCE32 *cond = new ConditionalCE32(context, ce32);
    if(cond == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return -1;
    }
    conditionalCE32s.addElement(cond, errorCode);
    return index;
}